

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_bKGD(png_structrp png_ptr,png_const_color_16p back,int color_type)

{
  png_byte local_22 [2];
  png_byte local_20 [2];
  png_byte local_1e [2];
  undefined1 auStack_1c [2];
  png_byte buf [6];
  int color_type_local;
  png_const_color_16p back_local;
  png_structrp png_ptr_local;
  
  _auStack_1c = color_type;
  unique0x100001de = back;
  if (color_type == 3) {
    if (((png_ptr->num_palette == 0) && ((png_ptr->mng_features_permitted & 1) != 0)) ||
       ((ushort)back->index < png_ptr->num_palette)) {
      local_22[0] = back->index;
      png_write_complete_chunk(png_ptr,0x624b4744,local_22,1);
    }
    else {
      png_warning(png_ptr,"Invalid background palette index");
    }
  }
  else if ((color_type & 2U) == 0) {
    if ((int)(uint)back->gray < 1 << (png_ptr->bit_depth & 0x1f)) {
      png_save_uint_16(local_22,(uint)back->gray);
      png_write_complete_chunk(png_ptr,0x624b4744,local_22,2);
    }
    else {
      png_warning(png_ptr,"Ignoring attempt to write bKGD chunk out-of-range for bit_depth");
    }
  }
  else {
    png_save_uint_16(local_22,(uint)back->red);
    png_save_uint_16(local_20,(uint)stack0xffffffffffffffe8->green);
    png_save_uint_16(local_1e,(uint)stack0xffffffffffffffe8->blue);
    if ((png_ptr->bit_depth == '\b') &&
       ((local_22[0] != '\0' || local_20[0] != '\0') || local_1e[0] != '\0')) {
      png_warning(png_ptr,"Ignoring attempt to write 16-bit bKGD chunk when bit_depth is 8");
    }
    else {
      png_write_complete_chunk(png_ptr,0x624b4744,local_22,6);
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_bKGD(png_structrp png_ptr, png_const_color_16p back, int color_type)
{
   png_byte buf[6];

   png_debug(1, "in png_write_bKGD");

   if (color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if (
#ifdef PNG_MNG_FEATURES_SUPPORTED
          (png_ptr->num_palette != 0 ||
          (png_ptr->mng_features_permitted & PNG_FLAG_MNG_EMPTY_PLTE) == 0) &&
#endif
         back->index >= png_ptr->num_palette)
      {
         png_warning(png_ptr, "Invalid background palette index");
         return;
      }

      buf[0] = back->index;
      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)1);
   }

   else if ((color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_save_uint_16(buf, back->red);
      png_save_uint_16(buf + 2, back->green);
      png_save_uint_16(buf + 4, back->blue);
#ifdef PNG_WRITE_16BIT_SUPPORTED
      if (png_ptr->bit_depth == 8 && (buf[0] | buf[2] | buf[4]) != 0)
#else
      if ((buf[0] | buf[2] | buf[4]) != 0)
#endif
      {
         png_warning(png_ptr,
             "Ignoring attempt to write 16-bit bKGD chunk "
             "when bit_depth is 8");

         return;
      }

      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)6);
   }

   else
   {
      if (back->gray >= (1 << png_ptr->bit_depth))
      {
         png_warning(png_ptr,
             "Ignoring attempt to write bKGD chunk out-of-range for bit_depth");

         return;
      }

      png_save_uint_16(buf, back->gray);
      png_write_complete_chunk(png_ptr, png_bKGD, buf, (png_size_t)2);
   }
}